

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O3

void __thiscall
hwtest::pgraph::MthdKelvinLineStipplePattern::emulate_mthd(MthdKelvinLineStipplePattern *this)

{
  pgraph_state *state;
  uint uVar1;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  pgraph_kelvin_check_err18(state);
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar1 = uVar1 & 0xffff0000 |
          (uint)(byte)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                      bundle_line_stipple | (uVar1 & 0xff) << 8;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_line_stipple = uVar1;
  pgraph_bundle(state,0x18,0,uVar1,true);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		pgraph_kelvin_check_err18(&exp);
		if (!exp.nsource) {
			insrt(exp.bundle_line_stipple, 8, 8, extr(val, 0, 8));
			insrt(exp.bundle_line_stipple, 16, 16, extr(val, 16, 16));
			pgraph_bundle(&exp, BUNDLE_LINE_STIPPLE, 0, exp.bundle_line_stipple, true);
		}
	}